

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModel::setRecursiveFilteringEnabled(QSortFilterProxyModel *this,bool recursive)

{
  long lVar1;
  byte bVar2;
  parameter_type pVar3;
  QSortFilterProxyModelPrivate *this_00;
  byte in_SIL;
  long in_FS_OFFSET;
  QSortFilterProxyModelPrivate *d;
  Directions in_stack_000000ac;
  QSortFilterProxyModelPrivate *pQVar4;
  Direction flags;
  undefined7 in_stack_ffffffffffffffb0;
  QModelIndex *in_stack_ffffffffffffffe0;
  QSortFilterProxyModelPrivate *in_stack_ffffffffffffffe8;
  QSortFilterProxyModelPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  this_00 = d_func((QSortFilterProxyModel *)0x879cde);
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
              *)CONCAT17(bVar2,in_stack_ffffffffffffffb0));
  pVar3 = ::QObjectCompatProperty::operator_cast_to_bool
                    ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
                      *)0x879d05);
  if (pVar3 != (parameter_type)(bVar2 & 1)) {
    pQVar4 = this_00;
    QModelIndex::QModelIndex((QModelIndex *)0x879d30);
    flags = (Direction)((ulong)pQVar4 >> 0x20);
    QSortFilterProxyModelPrivate::filter_about_to_be_changed
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    QPropertyData<bool>::setValueBypassingBindings
              (&(this_00->filter_recursive).super_QPropertyData<bool>,(parameter_type)(bVar2 & 1));
    QFlags<QSortFilterProxyModel::Direction>::QFlags
              ((QFlags<QSortFilterProxyModel::Direction> *)this_00,flags);
    QModelIndex::QModelIndex((QModelIndex *)0x879d7b);
    QSortFilterProxyModelPrivate::filter_changed
              (in_stack_fffffffffffffff0,in_stack_000000ac,(QModelIndex *)in_stack_ffffffffffffffe8)
    ;
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
    ::notify((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
              *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModel::setRecursiveFilteringEnabled(bool recursive)
{
    Q_D(QSortFilterProxyModel);
    d->filter_recursive.removeBindingUnlessInWrapper();
    if (d->filter_recursive == recursive)
        return;
    d->filter_about_to_be_changed();
    d->filter_recursive.setValueBypassingBindings(recursive);
    d->filter_changed(Direction::Rows);
    d->filter_recursive.notify(); // also emits a signal
}